

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

char * cram_content_type2str(cram_content_type t)

{
  char *pcStack_10;
  cram_content_type t_local;
  
  switch(t) {
  case FILE_HEADER:
    pcStack_10 = "FILE_HEADER";
    break;
  case COMPRESSION_HEADER:
    pcStack_10 = "COMPRESSION_HEADER";
    break;
  case MAPPED_SLICE:
    pcStack_10 = "MAPPED_SLICE";
    break;
  case UNMAPPED_SLICE:
    pcStack_10 = "UNMAPPED_SLICE";
    break;
  case EXTERNAL:
    pcStack_10 = "EXTERNAL";
    break;
  case CORE:
    pcStack_10 = "CORE";
    break;
  case CT_ERROR:
  default:
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

char *cram_content_type2str(enum cram_content_type t) {
    switch (t) {
    case FILE_HEADER:         return "FILE_HEADER";
    case COMPRESSION_HEADER:  return "COMPRESSION_HEADER";
    case MAPPED_SLICE:        return "MAPPED_SLICE";
    case UNMAPPED_SLICE:      return "UNMAPPED_SLICE";
    case EXTERNAL:            return "EXTERNAL";
    case CORE:                return "CORE";
    case CT_ERROR:            break;
    }
    return "?";
}